

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_states.cpp
# Opt level: O3

FName CheckCastKludges(FName *in)

{
  int iVar1;
  int *in_RDI;
  
  iVar1 = in->Index;
  if (iVar1 < 0x22f) {
    if (iVar1 == 0x22c) {
      iVar1 = 0x247;
    }
    else if (iVar1 == 0x22e) {
      iVar1 = 0x248;
    }
  }
  else if (iVar1 == 0x22f) {
    iVar1 = 0x24a;
  }
  else if (iVar1 == 0x238) {
    iVar1 = 0x249;
  }
  *in_RDI = iVar1;
  return (FName)(int)in_RDI;
}

Assistant:

FName CheckCastKludges(FName in)
{
	switch (in)
	{
	case NAME_Int:
		return NAME___decorate_internal_int__;
	case NAME_Bool:
		return NAME___decorate_internal_bool__;
	case NAME_State:
		return NAME___decorate_internal_state__;
	case NAME_Float:
		return NAME___decorate_internal_float__;
	default:
		return in;
	}
}